

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  QStyle *style_00;
  Style *this;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QString style;
  Settings settings;
  QApplication a;
  MainWindow w;
  QStringList keys;
  int local_1bc;
  QMetaTypeInterface *local_1b8;
  Editor *pEStack_1b0;
  qsizetype local_1a8;
  QArrayData *local_1a0;
  QChar *local_198;
  longlong local_190;
  QArrayData *local_188 [3];
  Settings local_170;
  QMetaTypeInterface *local_e8;
  Editor *pEStack_e0;
  qsizetype local_d8;
  QApplication local_c8 [16];
  undefined1 local_b8 [16];
  qsizetype local_a8;
  QArrayDataPointer<QString> local_28;
  
  local_170.mEditors.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<RegExp>::metaType;
  local_1bc = argc;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<RegExp>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::idHelper();
  }
  local_170.mEditors.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<RegExpPath>::metaType;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<RegExpPath>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::idHelper();
  }
  local_170.mEditors.d.d =
       (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<RegExpReplacement>::metaType;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<RegExpReplacement>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::idHelper();
  }
  local_170.mEditors.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<SearchParams>::metaType;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<SearchParams>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::idHelper();
  }
  local_170.mEditors.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<ReplaceParams>::metaType;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<ReplaceParams>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::idHelper();
  }
  local_170.mEditors.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<SearchHits>::metaType;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<SearchHits>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::idHelper();
  }
  local_170.mEditors.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<CountFilesParams>::metaType
  ;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<CountFilesParams>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::idHelper();
  }
  local_170.mEditors.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<GetListingParams>::metaType
  ;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<GetListingParams>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::idHelper();
  }
  local_170.mEditors.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<ReplacedParams>::metaType;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<ReplacedParams>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::idHelper();
  }
  local_170.mEditors.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<RenameParams>::metaType;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<RenameParams>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::idHelper();
  }
  local_170.mEditors.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<SearchNameHits>::metaType;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<SearchNameHits>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::idHelper();
  }
  QApplication::QApplication(local_c8,&local_1bc,argv,0x60204);
  QVar3.m_data = (storage_type *)0x9;
  QVar3.m_size = (qsizetype)&local_170;
  QString::fromUtf8(QVar3);
  local_b8._0_8_ = local_170.mEditors.d.d;
  local_b8._8_8_ = local_170.mEditors.d.ptr;
  local_a8 = local_170.mEditors.d.size;
  QCoreApplication::setApplicationName((QString *)local_b8);
  if ((QMetaTypeInterface *)local_b8._0_8_ != (QMetaTypeInterface *)0x0) {
    LOCK();
    *(int *)(ushort *)local_b8._0_8_ = *(int *)(ushort *)local_b8._0_8_ + -1;
    UNLOCK();
    if (*(int *)(ushort *)local_b8._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,8);
    }
  }
  QVar4.m_data = (storage_type *)0x5;
  QVar4.m_size = (qsizetype)&local_170;
  QString::fromUtf8(QVar4);
  local_b8._0_8_ = local_170.mEditors.d.d;
  local_b8._8_8_ = local_170.mEditors.d.ptr;
  local_a8 = local_170.mEditors.d.size;
  QCoreApplication::setApplicationVersion((QString *)local_b8);
  if ((QMetaTypeInterface *)local_b8._0_8_ != (QMetaTypeInterface *)0x0) {
    LOCK();
    *(int *)(ushort *)local_b8._0_8_ = *(int *)(ushort *)local_b8._0_8_ + -1;
    UNLOCK();
    if (*(int *)(ushort *)local_b8._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,8);
    }
  }
  Settings::Settings(&local_170);
  QStyleFactory::keys();
  QVar5.m_data = (storage_type *)0x6;
  QVar5.m_size = (qsizetype)local_b8;
  QString::fromUtf8(QVar5);
  local_1b8 = (QMetaTypeInterface *)local_b8._0_8_;
  pEStack_1b0 = (Editor *)local_b8._8_8_;
  local_1a8 = local_a8;
  style_00 = (QStyle *)QStyleFactory::create((QString *)&local_1b8);
  if (local_1b8 != (QMetaTypeInterface *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&local_1b8->revision)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&local_1b8->revision)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&local_1b8->revision)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_1b8,2,8);
    }
  }
  this = (Style *)operator_new(0x18);
  Style::Style(this,style_00);
  QApplication::setStyle((QStyle *)this);
  Settings::style(&local_170);
  if (local_198 == (QChar *)0x0) {
    local_198 = (QChar *)&QString::_empty;
  }
  iVar2 = QString::compare_helper(local_198,local_190,"dark",-1,CaseSensitive);
  if (iVar2 == 0) {
    StyleHelper::setDarkStyle();
  }
  else {
    StyleHelper::setLightStyle();
  }
  MainWindow::MainWindow((MainWindow *)local_b8,&local_170,(QWidget *)0x0);
  QWidget::show();
  QCoreApplication::applicationDirPath();
  QVar6.m_data = (storage_type *)0x5;
  QVar6.m_size = (qsizetype)&local_1b8;
  QString::fromUtf8(QVar6);
  local_e8 = local_1b8;
  pEStack_e0 = pEStack_1b0;
  local_d8 = local_1a8;
  cVar1 = QString::endsWith((QString *)local_188,(CaseSensitivity)&local_e8);
  if (local_e8 != (QMetaTypeInterface *)0x0) {
    LOCK();
    *(int *)&local_e8->revision = *(int *)&local_e8->revision + -1;
    iVar2._0_2_ = local_e8->revision;
    iVar2._2_2_ = local_e8->alignment;
    UNLOCK();
    if (iVar2 == 0) {
      QArrayData::deallocate((QArrayData *)local_e8,2,8);
    }
  }
  if (local_188[0] != (QArrayData *)0x0) {
    LOCK();
    (local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_188[0],2,8);
    }
  }
  if (cVar1 != '\0') {
    LineContext::testParseCpp();
    LineContext::testParsePy();
  }
  iVar2 = QApplication::exec();
  MainWindow::~MainWindow((MainWindow *)local_b8);
  if (local_1a0 != (QArrayData *)0x0) {
    LOCK();
    (local_1a0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1a0,2,8);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
  Settings::~Settings(&local_170);
  QApplication::~QApplication(local_c8);
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
    //QTextCodec::setCodecForCStrings(QTextCodec::codecForName("UTF-8"));

    qRegisterMetaType<RegExp>();
    qRegisterMetaType<RegExpPath>();
    qRegisterMetaType<RegExpReplacement>();
    qRegisterMetaType<SearchParams>();
    qRegisterMetaType<ReplaceParams>();
    qRegisterMetaType<SearchHits>();
    qRegisterMetaType<CountFilesParams>();
    qRegisterMetaType<GetListingParams>();
    qRegisterMetaType<ReplacedParams>();
    qRegisterMetaType<RenameParams>();
    qRegisterMetaType<SearchNameHits>();

    QApplication a(argc, argv);
    a.setApplicationName(APP_NAME);
    a.setApplicationVersion(VERSION);

    Settings settings;

    QStringList keys = QStyleFactory::keys();

    QStyle* fusion = QStyleFactory::create("Fusion");
    Style* style_ = new Style(fusion);

    qApp->setStyle(style_);

    QString style = settings.style();
    if (style == "dark") {
        StyleHelper::setDarkStyle();
    } else {
        StyleHelper::setLightStyle();
    }

    //
    /*a.setStyle("Windows");
    QStringList keys = QStyleFactory::keys();
    qDebug() << keys[0];*/
    //RegExpPath::test();
    //RegExp::test();
    //SearchResultRenderer::testDoZebra();

    MainWindow w(&settings);
    w.show();

    if (a.applicationDirPath().endsWith("debug")) {
        LineContext::testParseCpp();
        LineContext::testParsePy();
    }

    //SearchCache::testTokenize();

    return a.exec();
}